

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool nlohmann::json_abi_v3_11_3::operator==(const_reference lhs,const_reference rhs)

{
  size_type sVar1;
  value_t vVar2;
  value_t vVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *unaff_retaddr;
  value_t rhs_type;
  value_t lhs_type;
  undefined1 in_stack_ffffffffffffffcf;
  undefined5 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd5;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  const_reference in_stack_ffffffffffffffd8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar6;
  
  vVar2 = basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::type((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_RDI);
  vVar3 = basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::type((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_RSI);
  if (vVar2 == vVar3) {
    switch(vVar2) {
    case null:
      bVar6 = true;
      break;
    case object:
      bVar6 = std::operator==((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                               *)in_RDI,
                              (vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                               *)in_RSI);
      break;
    case array:
      bVar6 = std::operator==((vector<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                               *)in_RDI,
                              (vector<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                               *)in_RSI);
      break;
    case string:
      bVar6 = std::operator==(in_RDI,in_RSI);
      break;
    case boolean:
      bVar6 = ((byte)in_RDI->_M_string_length & 1) == ((byte)in_RSI->_M_string_length & 1);
      break;
    case number_integer:
      bVar6 = in_RDI->_M_string_length == in_RSI->_M_string_length;
      break;
    case number_unsigned:
      bVar6 = in_RDI->_M_string_length == in_RSI->_M_string_length;
      break;
    case number_float:
      bVar6 = (double)in_RDI->_M_string_length == (double)in_RSI->_M_string_length;
      break;
    case binary:
      bVar6 = byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator==(unaff_retaddr,
                           (byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      break;
    case discarded:
    default:
      bVar6 = false;
    }
  }
  else if ((vVar2 == number_integer) && (vVar3 == number_float)) {
    bVar6 = (double)(long)in_RDI->_M_string_length == (double)in_RSI->_M_string_length;
  }
  else if ((vVar2 == number_float) && (vVar3 == number_integer)) {
    bVar6 = (double)in_RDI->_M_string_length == (double)(long)in_RSI->_M_string_length;
  }
  else if ((vVar2 == number_unsigned) && (vVar3 == number_float)) {
    sVar1 = in_RDI->_M_string_length;
    auVar4._8_4_ = (int)(sVar1 >> 0x20);
    auVar4._0_8_ = sVar1;
    auVar4._12_4_ = 0x45300000;
    bVar6 = (auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0) ==
            (double)in_RSI->_M_string_length;
  }
  else if ((vVar2 == number_float) && (vVar3 == number_unsigned)) {
    sVar1 = in_RSI->_M_string_length;
    auVar5._8_4_ = (int)(sVar1 >> 0x20);
    auVar5._0_8_ = sVar1;
    auVar5._12_4_ = 0x45300000;
    bVar6 = (double)in_RDI->_M_string_length ==
            (auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0);
  }
  else if ((vVar2 == number_unsigned) && (vVar3 == number_integer)) {
    bVar6 = in_RDI->_M_string_length == in_RSI->_M_string_length;
  }
  else if ((vVar2 == number_integer) && (vVar3 == number_unsigned)) {
    bVar6 = in_RDI->_M_string_length == in_RSI->_M_string_length;
  }
  else {
    bVar6 = basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::compares_unordered
                      (in_stack_ffffffffffffffd8,
                       (const_reference)
                       CONCAT17(in_stack_ffffffffffffffd7,
                                CONCAT16(in_stack_ffffffffffffffd6,
                                         CONCAT15(in_stack_ffffffffffffffd5,
                                                  in_stack_ffffffffffffffd0))),
                       (bool)in_stack_ffffffffffffffcf);
    if (bVar6) {
      bVar6 = false;
    }
    else {
      bVar6 = false;
    }
  }
  return bVar6;
}

Assistant:

friend bool operator==(const_reference lhs, const_reference rhs) noexcept
    {
#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wfloat-equal"
#endif
        JSON_IMPLEMENT_OPERATOR( ==, true, false, false)
#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif
    }